

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O1

int add_A_record(record *record,void *data)

{
  char *__s;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  time_t tVar8;
  undefined8 *puVar9;
  size_t sVar10;
  char *__dest;
  undefined8 uVar11;
  int iVar12;
  
  iVar12 = 0;
  tVar8 = time((time_t *)0x0);
  if (tVar8 <= *(long *)((long)data + 0x30)) {
    if (record->size < 1) {
      puVar9 = (undefined8 *)malloc(0x40);
      record->data = puVar9;
      uVar11 = *(undefined8 *)((long)data + 8);
      uVar1 = *(undefined8 *)((long)data + 0x10);
      uVar2 = *(undefined8 *)((long)data + 0x18);
      uVar3 = *(undefined8 *)((long)data + 0x20);
      uVar4 = *(undefined8 *)((long)data + 0x28);
      uVar5 = *(undefined8 *)((long)data + 0x30);
      uVar6 = *(undefined8 *)((long)data + 0x38);
      *puVar9 = *data;
      puVar9[1] = uVar11;
      puVar9[2] = uVar1;
      puVar9[3] = uVar2;
      puVar9[4] = uVar3;
      puVar9[5] = uVar4;
      puVar9[6] = uVar5;
      puVar9[7] = uVar6;
      __s = *data;
      sVar10 = strlen(__s);
      __dest = (char *)malloc((long)((int)sVar10 + 1));
      *puVar9 = __dest;
      strcpy(__dest,__s);
      record->size = (int)sVar10 + 0x41;
      uVar11 = 0;
    }
    else {
      puVar9 = (undefined8 *)record->data;
      uVar11 = puVar9[7];
      uVar1 = *data;
      uVar2 = *(undefined8 *)((long)data + 8);
      uVar3 = *(undefined8 *)((long)data + 0x10);
      uVar4 = *(undefined8 *)((long)data + 0x18);
      uVar5 = *(undefined8 *)((long)data + 0x28);
      uVar6 = *(undefined8 *)((long)data + 0x30);
      uVar7 = *(undefined8 *)((long)data + 0x38);
      puVar9[4] = *(undefined8 *)((long)data + 0x20);
      puVar9[5] = uVar5;
      puVar9[2] = uVar3;
      puVar9[3] = uVar4;
      *puVar9 = uVar1;
      puVar9[1] = uVar2;
      puVar9[6] = uVar6;
      puVar9[7] = uVar7;
      puVar9 = (undefined8 *)record->data;
    }
    puVar9[7] = uVar11;
    iVar12 = record->size;
  }
  return iVar12;
}

Assistant:

int add_A_record(struct record*record,void*data){
  time_t now = time(NULL);
  struct record_data*tmp;
  int len = 0;
  if(((struct record_data*)data)->ttl<now)return 0;
  int sizeofstruct = sizeof(struct record_data);
  if(record->size>0){
    //目前不可能执行这一段
    #ifdef LOG_INCLUDED
    log_debug("replace new A record;label= %s",((struct record_data*)record->data)->label);
    #endif 
    tmp = ((struct record_data*)record->data)->next;
    // memcpy_s(record->data,sizeofstruct,data,sizeofstruct);//覆盖原数据
    memcpy(record->data,data,sizeofstruct);//覆盖原数据
    ((struct record_data*)record->data)->next=tmp;
  }else{
    #ifdef LOG_INCLUDED
    log_debug("record has no data before");
    #endif 
    record->data = malloc(sizeofstruct);
    memcpy(record->data,data,sizeofstruct);
    // memcpy_s(record->data,sizeofstruct,data,sizeofstruct);
    len = strlen(((struct record_data*)data)->label) + 1;//注意加1
    ((struct record_data*)record->data)->label = malloc(len);
    strcpy(((struct record_data*)record->data)->label,((struct record_data*)data)->label);//复制name
    // strcpy_s(((struct record_data*)record->data)->label,len,((struct record_data*)data)->label);//复制name
    record->size = sizeofstruct + len;
    #ifdef LOG_INCLUDED
    log_debug("add new A record;label= %s,ip=%d",((struct record_data*)record->data)->label,((struct record_data*)record->data)->ip.addr.v4);
    #endif 
    ((struct record_data*)record->data)->next=NULL;
  }
  return record->size;
}